

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

unsigned_long hash_string(char *string,size_t n)

{
  unsigned_long uVar1;
  size_t i;
  size_t sVar2;
  
  uVar1 = 0x1505;
  for (sVar2 = 0; (n != sVar2 && ((ulong)(byte)string[sVar2] != 0)); sVar2 = sVar2 + 1) {
    uVar1 = uVar1 * 0x21 + (ulong)(byte)string[sVar2];
  }
  return uVar1;
}

Assistant:

static unsigned long hash_string(const char *string, size_t n) {
#ifdef PARSON_FORCE_HASH_COLLISIONS
    (void)string;
    (void)n;
    return 0;
#else
    unsigned long hash = 5381;
    unsigned char c;
    size_t i = 0;
    for (i = 0; i < n; i++) {
        c = string[i];
        if (c == '\0') {
            break;
        }
        hash = ((hash << 5) + hash) + c; /* hash * 33 + c */
    }
    return hash;
#endif
}